

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O2

string * __thiscall
iutest::detail::iuCodeMessage::make_newline_message_abi_cxx11_
          (string *__return_storage_ptr__,iuCodeMessage *this)

{
  string local_30;
  
  make_message_abi_cxx11_(&local_30,this);
  std::operator+(__return_storage_ptr__,&local_30,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

::std::string make_newline_message() const
    {
        return make_message() + "\n";
    }